

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

InstanceSymbol *
slang::ast::InstanceSymbol::createInvalid(Compilation *compilation,DefinitionSymbol *definition)

{
  InstanceBodySymbol *args_2;
  InstanceSymbol *pIVar1;
  
  args_2 = InstanceBodySymbol::fromDefinition
                     (compilation,definition,(definition->super_Symbol).location,
                      (bitmask<slang::ast::InstanceFlags>)0x1,(HierarchyOverrideNode *)0x0,
                      (ConfigBlockSymbol *)0x0,(ConfigRule *)0x0);
  pIVar1 = BumpAllocator::
           emplace<slang::ast::InstanceSymbol,char_const(&)[1],slang::SourceLocation_const&,slang::ast::InstanceBodySymbol&>
                     (&compilation->super_BumpAllocator,(char (*) [1])0x401ea3,
                      (SourceLocation *)&SourceLocation::NoLocation,args_2);
  return pIVar1;
}

Assistant:

InstanceSymbol& InstanceSymbol::createInvalid(Compilation& compilation,
                                              const DefinitionSymbol& definition) {
    // Give this instance an empty name so that it can't be referenced by name.
    return *compilation.emplace<InstanceSymbol>(
        "", SourceLocation::NoLocation,
        InstanceBodySymbol::fromDefinition(compilation, definition, definition.location,
                                           InstanceFlags::Uninstantiated, nullptr, nullptr,
                                           nullptr));
}